

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FileDescriptorToBase64_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  string fdp_bytes;
  FileDescriptorProto fdp;
  string local_108;
  FileDescriptorProto local_e8;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  FileDescriptorProto::FileDescriptorProto(&local_e8);
  FileDescriptor::CopyTo((FileDescriptor *)this,&local_e8);
  MessageLite::SerializeToString((MessageLite *)&local_e8,&local_108);
  StringToBase64(__return_storage_ptr__,&local_108);
  FileDescriptorProto::~FileDescriptorProto(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptorToBase64(const FileDescriptor* descriptor) {
  std::string fdp_bytes;
  FileDescriptorProto fdp;
  descriptor->CopyTo(&fdp);
  fdp.SerializeToString(&fdp_bytes);
  return StringToBase64(fdp_bytes);
}